

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::Matchers::Impl::StdString::Equals::toString_abi_cxx11_
          (string *__return_storage_ptr__,Equals *this)

{
  size_type *psVar1;
  Choice CVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  std::operator+(&local_80,"equals: \"",&(this->m_data).m_str);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_30 = *puVar6;
    uStack_28 = (undefined4)plVar4[3];
    uStack_24 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_40 = &local_30;
  }
  else {
    local_30 = *puVar6;
    local_40 = (ulong *)*plVar4;
  }
  local_38 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  CVar2 = (this->m_data).m_caseSensitivity;
  pcVar8 = "";
  if (CVar2 == No) {
    pcVar8 = " (case insensitive)";
  }
  pcVar7 = pcVar8 + 0x13;
  if (CVar2 != No) {
    pcVar7 = pcVar8;
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar8,pcVar7);
  uVar9 = 0xf;
  if (local_40 != &local_30) {
    uVar9 = local_30;
  }
  if (uVar9 < (ulong)(local_58 + local_38)) {
    uVar9 = 0xf;
    if (local_60 != local_50) {
      uVar9 = local_50[0];
    }
    if ((ulong)(local_58 + local_38) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
      goto LAB_0013bc91;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
LAB_0013bc91:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar3 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() const {
                return "equals: \"" + m_data.m_str + "\"" + m_data.toStringSuffix();
            }